

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

void __thiscall QMetaStringTable::QMetaStringTable(QMetaStringTable *this,QByteArray *className)

{
  Data *pDVar1;
  
  (this->m_entries).d = (Data *)0x0;
  this->m_index = 0;
  pDVar1 = (className->d).d;
  (this->m_className).d.d = pDVar1;
  (this->m_className).d.ptr = (className->d).ptr;
  (this->m_className).d.size = (className->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  enter(this,&this->m_className);
  return;
}

Assistant:

QMetaStringTable::QMetaStringTable(const QByteArray &className)
    : m_index(0)
    , m_className(className)
{
    const int index = enter(m_className);
    Q_ASSERT(index == 0);
    Q_UNUSED(index);
}